

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringprintf.cc
# Opt level: O0

void re2::StringAppendV(string *dst,char *format,__va_list_tag *ap)

{
  char *__s;
  ulong uVar1;
  char *buf;
  int length;
  int result;
  va_list backup_ap;
  char local_428 [8];
  char space [1024];
  __va_list_tag *ap_local;
  char *format_local;
  string *dst_local;
  
  backup_ap[0].overflow_arg_area = ap->reg_save_area;
  length = ap->gp_offset;
  unique0x100000fb = ap->fp_offset;
  backup_ap[0]._0_8_ = ap->overflow_arg_area;
  buf._4_4_ = vsnprintf(local_428,0x400,format,&length);
  if (((int)buf._4_4_ < 0) || (0x3ff < buf._4_4_)) {
    buf._0_4_ = 0x400;
    while( true ) {
      if ((int)buf._4_4_ < 0) {
        buf._0_4_ = (int)buf << 1;
      }
      else {
        buf._0_4_ = buf._4_4_ + 1;
      }
      uVar1 = (ulong)(int)buf;
      if ((long)uVar1 < 0) {
        uVar1 = 0xffffffffffffffff;
      }
      __s = (char *)operator_new__(uVar1);
      backup_ap[0].overflow_arg_area = ap->reg_save_area;
      length = ap->gp_offset;
      unique0x1000011b = ap->fp_offset;
      backup_ap[0]._0_8_ = ap->overflow_arg_area;
      buf._4_4_ = vsnprintf(__s,(long)(int)buf,format,&length);
      if ((-1 < (int)buf._4_4_) && ((int)buf._4_4_ < (int)buf)) break;
      if (__s != (char *)0x0) {
        operator_delete__(__s);
      }
    }
    std::__cxx11::string::append((char *)dst,(ulong)__s);
    if (__s != (char *)0x0) {
      operator_delete__(__s);
    }
  }
  else {
    std::__cxx11::string::append((char *)dst,(ulong)local_428);
  }
  return;
}

Assistant:

static void StringAppendV(string* dst, const char* format, va_list ap) {
  // First try with a small fixed size buffer
  char space[1024];

  // It's possible for methods that use a va_list to invalidate
  // the data in it upon use.  The fix is to make a copy
  // of the structure before using it and use that copy instead.
  va_list backup_ap;
  va_copy(backup_ap, ap);
  int result = vsnprintf(space, sizeof(space), format, backup_ap);
  va_end(backup_ap);

  if ((result >= 0) && (static_cast<unsigned long>(result) < sizeof(space))) {
    // It fit
    dst->append(space, result);
    return;
  }

  // Repeatedly increase buffer size until it fits
  int length = sizeof(space);
  while (true) {
    if (result < 0) {
      // Older behavior: just try doubling the buffer size
      length *= 2;
    } else {
      // We need exactly "result+1" characters
      length = result+1;
    }
    char* buf = new char[length];

    // Restore the va_list before we use it again
    va_copy(backup_ap, ap);
#if !defined(_WIN32)
    result = vsnprintf(buf, length, format, backup_ap);
#else
    // On Windows, the function takes five arguments, not four. With an array,
    // the buffer size will be inferred, but not with a pointer. C'est la vie.
    // (See https://github.com/google/re2/issues/40 for more details.)
    result = vsnprintf(buf, length, _TRUNCATE, format, backup_ap);
#endif
    va_end(backup_ap);

    if ((result >= 0) && (result < length)) {
      // It fit
      dst->append(buf, result);
      delete[] buf;
      return;
    }
    delete[] buf;
  }
}